

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O2

void __thiscall
so_5::impl::local_mbox_details::subscriber_adaptive_container_t::insert
          (subscriber_adaptive_container_t *this,subscriber_info_t info)

{
  if (this->m_storage == vector) {
    if ((long)(this->m_vector).
              super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_vector).
              super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x400) {
      switch_storage_to_map(this);
      if (this->m_storage != vector) goto LAB_0024b8cf;
    }
    insert_to_vector(this,&info);
  }
  else {
LAB_0024b8cf:
    insert_to_map(this,&info);
  }
  return;
}

Assistant:

void
	insert( subscriber_info_t info )
		{
			if( is_vector() )
				{
					if( m_vector.size() == size_limits::switch_to_map )
						switch_storage_to_map();
				}

			if( is_vector() )
				insert_to_vector( std::move( info ) );
			else
				insert_to_map( std::move( info ) );
		}